

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void fetchTransformedBilinearARGB32PM_downscale_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  uchar *puVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  unkuint9 Var48;
  undefined1 auVar49 [11];
  undefined1 auVar50 [15];
  unkuint9 Var51;
  undefined1 auVar52 [11];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  int iVar63;
  uint uVar64;
  long lVar65;
  int iVar66;
  int iVar67;
  uint *puVar68;
  uint uVar69;
  int iVar70;
  ulong uVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  undefined1 auVar79 [16];
  undefined4 uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [12];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [12];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ulong uVar96;
  undefined1 auVar97 [12];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  short sVar103;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar131;
  short sVar132;
  short sVar133;
  short sVar134;
  short sVar135;
  short sVar136;
  undefined1 auVar89 [16];
  undefined1 auVar98 [16];
  
  uVar69 = (uint)*fy >> 8 & 0xff;
  iVar63 = *fy >> 0x10;
  iVar66 = image->y2 + -1;
  iVar74 = iVar66;
  if (iVar63 < iVar66) {
    iVar66 = iVar63;
    iVar74 = iVar63 + 1;
  }
  iVar67 = image->y1;
  if (iVar63 < iVar67) {
    iVar66 = iVar67;
    iVar74 = iVar67;
  }
  puVar16 = image->imageData;
  lVar75 = (long)iVar66 * image->bytesPerLine;
  lVar76 = (long)iVar74 * image->bytesPerLine;
  iVar66 = image->x1;
  iVar74 = image->x2;
  do {
    if (end <= b) break;
    iVar70 = (int)*(short *)((long)fx + 2);
    iVar63 = image->x1;
    iVar72 = image->x2 + -1;
    iVar67 = iVar72;
    if (iVar70 < iVar72) {
      iVar72 = iVar70;
      iVar67 = iVar70 + 1;
    }
    if (iVar72 == iVar67 || iVar70 < iVar63) {
      iVar73 = iVar72;
      if (iVar70 < iVar63) {
        iVar73 = iVar63;
      }
      uVar71 = (((ulong)*(uint *)(puVar16 + (long)iVar73 * 4 + lVar76) << 0x18 |
                (ulong)*(uint *)(puVar16 + (long)iVar73 * 4 + lVar76)) & 0xff00ff00ff00ff) *
               (ulong)uVar69 +
               (((ulong)*(uint *)(puVar16 + (long)iVar73 * 4 + lVar75) << 0x18 |
                (ulong)*(uint *)(puVar16 + (long)iVar73 * 4 + lVar75)) & 0xff00ff00ff00ff) *
               (0x100 - (ulong)uVar69) >> 8 & 0xff00ff00ff00ff;
      *b = (uint)(uVar71 >> 0x18) | (uint)uVar71;
      *fx = *fx + fdx;
      b = b + 1;
    }
  } while (iVar72 == iVar67 || iVar70 < iVar63);
  auVar79 = _DAT_006ce780;
  if (fdx < 1) {
    puVar68 = end;
    if (-1 < fdx) goto LAB_0066a8db;
    lVar65 = (long)iVar66 * 0x10000 - (long)*fx;
    uVar71 = (ulong)fdx;
  }
  else {
    lVar65 = ((long)iVar74 * 0x10000 + -0x10000) - (long)*fx;
    uVar71 = (ulong)(uint)fdx;
  }
  puVar68 = b + lVar65 / (long)uVar71;
  if (end < b + lVar65 / (long)uVar71) {
    puVar68 = end;
  }
LAB_0066a8db:
  iVar66 = *fx + fdx;
  iVar74 = iVar66 + fdx;
  auVar83._12_4_ = iVar74 + fdx;
  auVar83._8_4_ = iVar74;
  auVar83._4_4_ = iVar66;
  auVar83._0_4_ = *fx;
  if (b < puVar68 + -3) {
    auVar81 = ZEXT416(uVar69 + 8 >> 4);
    auVar81 = pshuflw(auVar81,auVar81,0);
    uVar80 = auVar81._0_4_;
    auVar82._4_4_ = uVar80;
    auVar82._0_4_ = uVar80;
    auVar82._8_4_ = uVar80;
    auVar82._12_4_ = uVar80;
    auVar82 = psllw(auVar82,4);
    do {
      iVar74 = auVar83._4_4_;
      uVar64 = auVar83._8_4_;
      iVar63 = auVar83._12_4_;
      lVar77 = (ulong)auVar83._6_2_ * 4;
      uVar71 = (ulong)((uVar64 >> 0x10) << 2);
      lVar65 = (ulong)auVar83._14_2_ * 4;
      uVar80 = *(undefined4 *)(puVar16 + lVar77 + lVar75);
      lVar78 = (ulong)auVar83._2_2_ * 4;
      uVar1 = *(undefined4 *)(puVar16 + lVar78 + lVar75);
      auVar99._4_4_ = uVar80;
      auVar99._0_4_ = uVar1;
      uVar2 = *(undefined4 *)(puVar16 + lVar65 + lVar75);
      uVar3 = *(undefined4 *)(puVar16 + uVar71 + lVar75);
      auVar99._12_4_ = uVar2;
      auVar99._8_4_ = uVar3;
      uVar4 = *(undefined4 *)(puVar16 + lVar77 + lVar75 + 4);
      uVar5 = *(undefined4 *)(puVar16 + lVar78 + lVar75 + 4);
      auVar100._4_4_ = uVar4;
      auVar100._0_4_ = uVar5;
      uVar6 = *(undefined4 *)(puVar16 + lVar65 + lVar75 + 4);
      uVar7 = *(undefined4 *)(puVar16 + uVar71 + lVar75 + 4);
      auVar100._12_4_ = uVar6;
      auVar100._8_4_ = uVar7;
      uVar8 = *(undefined4 *)(puVar16 + lVar77 + lVar76);
      uVar9 = *(undefined4 *)(puVar16 + lVar78 + lVar76);
      auVar101._4_4_ = uVar8;
      auVar101._0_4_ = uVar9;
      uVar10 = *(undefined4 *)(puVar16 + lVar65 + lVar76);
      uVar11 = *(undefined4 *)(puVar16 + uVar71 + lVar76);
      auVar101._12_4_ = uVar10;
      auVar101._8_4_ = uVar11;
      uVar12 = *(undefined4 *)(puVar16 + lVar77 + lVar76 + 4);
      uVar13 = *(undefined4 *)(puVar16 + lVar78 + lVar76 + 4);
      auVar102._4_4_ = uVar12;
      auVar102._0_4_ = uVar13;
      uVar14 = *(undefined4 *)(puVar16 + lVar65 + lVar76 + 4);
      uVar15 = *(undefined4 *)(puVar16 + uVar71 + lVar76 + 4);
      auVar104._0_8_ = CONCAT44(uVar14,uVar15);
      auVar104._8_8_ = 0;
      auVar102._8_8_ = auVar104._0_8_;
      iVar66 = CONCAT22(auVar83._2_2_ >> 8,auVar83._0_2_ >> 8);
      auVar84._0_8_ = CONCAT26(auVar83._6_2_ >> 8,CONCAT24(auVar83._4_2_ >> 8,iVar66));
      auVar84._8_2_ = auVar83._8_2_ >> 8;
      auVar84._10_2_ = auVar83._10_2_ >> 8;
      auVar86._12_2_ = auVar83._12_2_ >> 8;
      auVar86._0_12_ = auVar84;
      auVar86._14_2_ = auVar83._14_2_ >> 8;
      auVar85._0_4_ = iVar66 + 8;
      auVar85._4_4_ = (int)((ulong)auVar84._0_8_ >> 0x20) + 8;
      auVar85._8_4_ = auVar84._8_4_ + 8;
      auVar85._12_4_ = auVar86._12_4_ + 8;
      auVar86 = pshuflw(auVar85,auVar85,0xa0);
      auVar86 = pshufhw(auVar104,auVar86,0xa0);
      auVar105._0_2_ = auVar86._0_2_ >> 4;
      auVar105._2_2_ = auVar86._2_2_ >> 4;
      auVar105._4_2_ = auVar86._4_2_ >> 4;
      auVar105._6_2_ = auVar86._6_2_ >> 4;
      auVar105._8_2_ = auVar86._8_2_ >> 4;
      auVar105._10_2_ = auVar86._10_2_ >> 4;
      auVar105._12_2_ = auVar86._12_2_ >> 4;
      auVar105._14_2_ = auVar86._14_2_ >> 4;
      sVar133 = auVar81._0_2_;
      sVar121 = auVar105._0_2_ * sVar133;
      sVar135 = auVar81._2_2_;
      sVar123 = auVar105._2_2_ * sVar135;
      sVar125 = auVar105._4_2_ * sVar133;
      sVar127 = auVar105._6_2_ * sVar135;
      sVar129 = auVar105._8_2_ * sVar133;
      sVar131 = auVar105._10_2_ * sVar135;
      sVar133 = auVar105._12_2_ * sVar133;
      sVar135 = auVar105._14_2_ * sVar135;
      auVar86 = psllw(auVar105,4);
      sVar103 = auVar86._0_2_ - sVar121;
      sVar106 = auVar86._2_2_ - sVar123;
      sVar107 = auVar86._4_2_ - sVar125;
      sVar108 = auVar86._6_2_ - sVar127;
      sVar109 = auVar86._8_2_ - sVar129;
      sVar110 = auVar86._10_2_ - sVar131;
      sVar111 = auVar86._12_2_ - sVar133;
      sVar112 = auVar86._14_2_ - sVar135;
      sVar113 = auVar82._0_2_ - sVar121;
      sVar114 = auVar82._2_2_ - sVar123;
      sVar115 = auVar82._4_2_ - sVar125;
      sVar116 = auVar82._6_2_ - sVar127;
      sVar117 = auVar82._8_2_ - sVar129;
      sVar118 = auVar82._10_2_ - sVar131;
      sVar119 = auVar82._12_2_ - sVar133;
      sVar120 = auVar82._14_2_ - sVar135;
      auVar102 = auVar102 & auVar79;
      sVar122 = (sVar121 - (auVar82._0_2_ + auVar86._0_2_)) + 0x100;
      sVar124 = (sVar123 - (auVar82._2_2_ + auVar86._2_2_)) + 0x100;
      sVar126 = (sVar125 - (auVar82._4_2_ + auVar86._4_2_)) + 0x100;
      sVar128 = (sVar127 - (auVar82._6_2_ + auVar86._6_2_)) + 0x100;
      sVar130 = (sVar129 - (auVar82._8_2_ + auVar86._8_2_)) + 0x100;
      sVar132 = (sVar131 - (auVar82._10_2_ + auVar86._10_2_)) + 0x100;
      sVar134 = (sVar133 - (auVar82._12_2_ + auVar86._12_2_)) + 0x100;
      sVar136 = (sVar135 - (auVar82._14_2_ + auVar86._14_2_)) + 0x100;
      auVar99 = auVar99 & auVar79;
      auVar100 = auVar100 & auVar79;
      auVar101 = auVar101 & auVar79;
      *(ushort *)b = (ushort)(auVar102._0_2_ * sVar121 +
                              auVar101._0_2_ * sVar113 + auVar100._0_2_ * sVar103 +
                             auVar99._0_2_ * sVar122) >> 8 |
                     ((ushort)uVar13 >> 8) * sVar121 +
                     ((ushort)uVar9 >> 8) * sVar113 + ((ushort)uVar5 >> 8) * sVar103 +
                     ((ushort)uVar1 >> 8) * sVar122 & 0xff00;
      *(ushort *)((long)b + 2) =
           (ushort)(auVar102._2_2_ * sVar123 + auVar101._2_2_ * sVar114 + auVar100._2_2_ * sVar106 +
                   auVar99._2_2_ * sVar124) >> 8 |
           (ushort)((uint)uVar13 >> 0x18) * sVar123 +
           (ushort)((uint)uVar9 >> 0x18) * sVar114 + (ushort)((uint)uVar5 >> 0x18) * sVar106 +
           (ushort)((uint)uVar1 >> 0x18) * sVar124 & 0xff00;
      *(ushort *)(b + 1) =
           (ushort)(auVar102._4_2_ * sVar125 + auVar101._4_2_ * sVar115 + auVar100._4_2_ * sVar107 +
                   auVar99._4_2_ * sVar126) >> 8 |
           ((ushort)uVar12 >> 8) * sVar125 +
           ((ushort)uVar8 >> 8) * sVar115 + ((ushort)uVar4 >> 8) * sVar107 +
           ((ushort)uVar80 >> 8) * sVar126 & 0xff00;
      *(ushort *)((long)b + 6) =
           (ushort)(auVar102._6_2_ * sVar127 + auVar101._6_2_ * sVar116 + auVar100._6_2_ * sVar108 +
                   auVar99._6_2_ * sVar128) >> 8 |
           (ushort)((uint)uVar12 >> 0x18) * sVar127 +
           (ushort)((uint)uVar8 >> 0x18) * sVar116 + (ushort)((uint)uVar4 >> 0x18) * sVar108 +
           (ushort)((uint)uVar80 >> 0x18) * sVar128 & 0xff00;
      *(ushort *)(b + 2) =
           (ushort)(auVar102._8_2_ * sVar129 + auVar101._8_2_ * sVar117 + auVar100._8_2_ * sVar109 +
                   auVar99._8_2_ * sVar130) >> 8 |
           ((ushort)uVar15 >> 8) * sVar129 +
           ((ushort)uVar11 >> 8) * sVar117 + ((ushort)uVar7 >> 8) * sVar109 +
           ((ushort)uVar3 >> 8) * sVar130 & 0xff00;
      *(ushort *)((long)b + 10) =
           (ushort)(auVar102._10_2_ * sVar131 +
                    auVar101._10_2_ * sVar118 + auVar100._10_2_ * sVar110 + auVar99._10_2_ * sVar132
                   ) >> 8 |
           (ushort)((uint)uVar15 >> 0x18) * sVar131 +
           (ushort)((uint)uVar11 >> 0x18) * sVar118 + (ushort)((uint)uVar7 >> 0x18) * sVar110 +
           (ushort)((uint)uVar3 >> 0x18) * sVar132 & 0xff00;
      *(ushort *)(b + 3) =
           (ushort)(auVar102._12_2_ * sVar133 +
                    auVar101._12_2_ * sVar119 + auVar100._12_2_ * sVar111 + auVar99._12_2_ * sVar134
                   ) >> 8 |
           ((ushort)uVar14 >> 8) * sVar133 +
           ((ushort)uVar10 >> 8) * sVar119 + ((ushort)uVar6 >> 8) * sVar111 +
           ((ushort)uVar2 >> 8) * sVar134 & 0xff00;
      *(ushort *)((long)b + 0xe) =
           (ushort)(auVar102._14_2_ * sVar135 +
                    auVar101._14_2_ * sVar120 + auVar100._14_2_ * sVar112 + auVar99._14_2_ * sVar136
                   ) >> 8 |
           (ushort)((uint)uVar14 >> 0x18) * sVar135 +
           (ushort)((uint)uVar10 >> 0x18) * sVar120 + (ushort)((uint)uVar6 >> 0x18) * sVar112 +
           (ushort)((uint)uVar2 >> 0x18) * sVar136 & 0xff00;
      b = b + 4;
      auVar83._0_4_ = auVar83._0_4_ + fdx * 4;
      auVar83._4_4_ = iVar74 + fdx * 4;
      auVar83._8_4_ = uVar64 + fdx * 4;
      auVar83._12_4_ = iVar63 + fdx * 4;
    } while (b < puVar68 + -3);
  }
  *fx = auVar83._0_4_;
  if (b < puVar68) {
    auVar79 = pshuflw(ZEXT416(0x100 - uVar69),ZEXT416(0x100 - uVar69),0);
    auVar83 = pshuflw(ZEXT416(uVar69),ZEXT416(uVar69),0);
    do {
      uVar64 = (uint)*fx >> 8 & 0xff;
      lVar65 = (long)(*fx >> 0x10);
      uVar71 = *(ulong *)(puVar16 + lVar65 * 4 + lVar75);
      uVar96 = *(ulong *)(puVar16 + lVar65 * 4 + lVar76);
      auVar17._8_6_ = 0;
      auVar17._0_8_ = uVar71;
      auVar17[0xe] = (char)(uVar71 >> 0x38);
      auVar21._8_4_ = 0;
      auVar21._0_8_ = uVar71;
      auVar21[0xc] = (char)(uVar71 >> 0x30);
      auVar21._13_2_ = auVar17._13_2_;
      auVar25._8_4_ = 0;
      auVar25._0_8_ = uVar71;
      auVar25._12_3_ = auVar21._12_3_;
      auVar29._8_2_ = 0;
      auVar29._0_8_ = uVar71;
      auVar29[10] = (char)(uVar71 >> 0x28);
      auVar29._11_4_ = auVar25._11_4_;
      auVar33._8_2_ = 0;
      auVar33._0_8_ = uVar71;
      auVar33._10_5_ = auVar29._10_5_;
      auVar37[8] = (char)(uVar71 >> 0x20);
      auVar37._0_8_ = uVar71;
      auVar37._9_6_ = auVar33._9_6_;
      auVar47._7_8_ = 0;
      auVar47._0_7_ = auVar37._8_7_;
      Var48 = CONCAT81(SUB158(auVar47 << 0x40,7),(char)(uVar71 >> 0x18));
      auVar57._9_6_ = 0;
      auVar57._0_9_ = Var48;
      auVar49._1_10_ = SUB1510(auVar57 << 0x30,5);
      auVar49[0] = (char)(uVar71 >> 0x10);
      auVar58._11_4_ = 0;
      auVar58._0_11_ = auVar49;
      auVar43[2] = (char)(uVar71 >> 8);
      auVar43._0_2_ = (ushort)uVar71;
      auVar43._3_12_ = SUB1512(auVar58 << 0x20,3);
      sVar133 = auVar79._0_2_;
      sVar135 = auVar79._2_2_;
      auVar18._8_6_ = 0;
      auVar18._0_8_ = uVar96;
      auVar18[0xe] = (char)(uVar96 >> 0x38);
      auVar22._8_4_ = 0;
      auVar22._0_8_ = uVar96;
      auVar22[0xc] = (char)(uVar96 >> 0x30);
      auVar22._13_2_ = auVar18._13_2_;
      auVar26._8_4_ = 0;
      auVar26._0_8_ = uVar96;
      auVar26._12_3_ = auVar22._12_3_;
      auVar30._8_2_ = 0;
      auVar30._0_8_ = uVar96;
      auVar30[10] = (char)(uVar96 >> 0x28);
      auVar30._11_4_ = auVar26._11_4_;
      auVar34._8_2_ = 0;
      auVar34._0_8_ = uVar96;
      auVar34._10_5_ = auVar30._10_5_;
      auVar38[8] = (char)(uVar96 >> 0x20);
      auVar38._0_8_ = uVar96;
      auVar38._9_6_ = auVar34._9_6_;
      auVar50._7_8_ = 0;
      auVar50._0_7_ = auVar38._8_7_;
      Var51 = CONCAT81(SUB158(auVar50 << 0x40,7),(char)(uVar96 >> 0x18));
      auVar59._9_6_ = 0;
      auVar59._0_9_ = Var51;
      auVar52._1_10_ = SUB1510(auVar59 << 0x30,5);
      auVar52[0] = (char)(uVar96 >> 0x10);
      auVar60._11_4_ = 0;
      auVar60._0_11_ = auVar52;
      auVar44[2] = (char)(uVar96 >> 8);
      auVar44._0_2_ = (ushort)uVar96;
      auVar44._3_12_ = SUB1512(auVar60 << 0x20,3);
      sVar103 = auVar83._0_2_;
      sVar106 = auVar83._2_2_;
      auVar90._0_4_ =
           CONCAT22(auVar44._2_2_ * sVar106 + auVar43._2_2_ * sVar135,
                    ((ushort)uVar96 & 0xff) * sVar103 + ((ushort)uVar71 & 0xff) * sVar133);
      auVar88._0_8_ =
           CONCAT26((short)Var51 * sVar106 + (short)Var48 * sVar135,
                    CONCAT24(auVar52._0_2_ * sVar103 + auVar49._0_2_ * sVar133,auVar90._0_4_));
      auVar88._8_2_ = auVar38._8_2_ * sVar103 + auVar37._8_2_ * sVar133;
      auVar88._10_2_ = auVar30._10_2_ * sVar106 + auVar29._10_2_ * sVar135;
      auVar89._12_2_ = auVar22._12_2_ * sVar103 + auVar21._12_2_ * sVar133;
      auVar89._0_12_ = auVar88;
      auVar89._14_2_ = (auVar18._13_2_ >> 8) * sVar106 + (auVar17._13_2_ >> 8) * sVar135;
      auVar81._0_4_ = CONCAT22((short)uVar64,(short)(0x100 - uVar64));
      auVar81._4_4_ = auVar81._0_4_;
      auVar81._8_4_ = auVar81._0_4_;
      auVar81._12_4_ = auVar81._0_4_;
      auVar90._12_4_ = auVar89._12_4_;
      auVar90._4_4_ = auVar88._8_4_;
      auVar90._8_4_ = (int)((ulong)auVar88._0_8_ >> 0x20);
      auVar82 = pshuflw(auVar90,auVar90,0xd8);
      auVar82 = pshufhw(auVar82,auVar82,0xd8);
      auVar91._0_2_ = auVar82._0_2_ >> 8;
      auVar91._2_2_ = auVar82._2_2_ >> 8;
      auVar91._4_2_ = auVar82._4_2_ >> 8;
      auVar91._6_2_ = auVar82._6_2_ >> 8;
      auVar91._8_2_ = auVar82._8_2_ >> 8;
      auVar91._10_2_ = auVar82._10_2_ >> 8;
      auVar91._12_2_ = auVar82._12_2_ >> 8;
      auVar91._14_2_ = auVar82._14_2_ >> 8;
      auVar81 = pmaddwd(auVar91,auVar81);
      auVar92._0_4_ = auVar81._0_4_ >> 8;
      auVar92._4_4_ = auVar81._4_4_ >> 8;
      auVar92._8_4_ = auVar81._8_4_ >> 8;
      auVar92._12_4_ = auVar81._12_4_ >> 8;
      auVar81 = packssdw(auVar92,auVar92);
      sVar133 = auVar81._0_2_;
      sVar135 = auVar81._2_2_;
      sVar103 = auVar81._4_2_;
      sVar106 = auVar81._6_2_;
      *b = CONCAT13((0 < sVar106) * (sVar106 < 0x100) * auVar81[6] - (0xff < sVar106),
                    CONCAT12((0 < sVar103) * (sVar103 < 0x100) * auVar81[4] - (0xff < sVar103),
                             CONCAT11((0 < sVar135) * (sVar135 < 0x100) * auVar81[2] -
                                      (0xff < sVar135),
                                      (0 < sVar133) * (sVar133 < 0x100) * auVar81[0] -
                                      (0xff < sVar133))));
      *fx = *fx + fdx;
      b = b + 1;
    } while (b < puVar68);
  }
  if (b < end) {
    auVar79 = pshuflw(ZEXT416(0x100 - uVar69),ZEXT416(0x100 - uVar69),0);
    auVar83 = pshuflw(ZEXT416(uVar69),ZEXT416(uVar69),0);
    do {
      iVar66 = image->x1;
      iVar74 = image->x2 + -1;
      iVar67 = *fx >> 0x10;
      iVar63 = iVar74;
      if (iVar67 < iVar74) {
        iVar74 = iVar67;
        iVar63 = iVar67 + 1;
      }
      if (iVar67 < iVar66) {
        iVar74 = iVar66;
        iVar63 = iVar66;
      }
      uVar69 = (uint)*fx >> 8 & 0xff;
      uVar80 = *(undefined4 *)(puVar16 + (long)iVar63 * 4 + lVar75);
      uVar1 = *(undefined4 *)(puVar16 + (long)iVar74 * 4 + lVar75);
      uVar2 = *(undefined4 *)(puVar16 + (long)iVar63 * 4 + lVar76);
      uVar3 = *(undefined4 *)(puVar16 + (long)iVar74 * 4 + lVar76);
      uVar71 = CONCAT44(uVar80,uVar1);
      uVar96 = CONCAT44(uVar2,uVar3);
      auVar19._8_6_ = 0;
      auVar19._0_8_ = uVar71;
      auVar19[0xe] = (char)((uint)uVar80 >> 0x18);
      auVar23._8_4_ = 0;
      auVar23._0_8_ = uVar71;
      auVar23[0xc] = (char)((uint)uVar80 >> 0x10);
      auVar23._13_2_ = auVar19._13_2_;
      auVar27._8_4_ = 0;
      auVar27._0_8_ = uVar71;
      auVar27._12_3_ = auVar23._12_3_;
      auVar31._8_2_ = 0;
      auVar31._0_8_ = uVar71;
      auVar31[10] = (char)((uint)uVar80 >> 8);
      auVar31._11_4_ = auVar27._11_4_;
      auVar35._8_2_ = 0;
      auVar35._0_8_ = uVar71;
      auVar35._10_5_ = auVar31._10_5_;
      auVar39[8] = (char)uVar80;
      auVar39._0_8_ = uVar71;
      auVar39._9_6_ = auVar35._9_6_;
      auVar53._7_8_ = 0;
      auVar53._0_7_ = auVar39._8_7_;
      Var48 = CONCAT81(SUB158(auVar53 << 0x40,7),(char)((uint)uVar1 >> 0x18));
      auVar61._9_6_ = 0;
      auVar61._0_9_ = Var48;
      auVar41[4] = (char)((uint)uVar1 >> 0x10);
      auVar41._0_4_ = uVar1;
      auVar41._5_10_ = SUB1510(auVar61 << 0x30,5);
      auVar54._11_4_ = 0;
      auVar54._0_11_ = auVar41._4_11_;
      auVar45[2] = (char)((uint)uVar1 >> 8);
      auVar45._0_2_ = (ushort)uVar1;
      auVar45._3_12_ = SUB1512(auVar54 << 0x20,3);
      auVar20._8_6_ = 0;
      auVar20._0_8_ = uVar96;
      auVar20[0xe] = (char)((uint)uVar2 >> 0x18);
      auVar24._8_4_ = 0;
      auVar24._0_8_ = uVar96;
      auVar24[0xc] = (char)((uint)uVar2 >> 0x10);
      auVar24._13_2_ = auVar20._13_2_;
      auVar28._8_4_ = 0;
      auVar28._0_8_ = uVar96;
      auVar28._12_3_ = auVar24._12_3_;
      auVar32._8_2_ = 0;
      auVar32._0_8_ = uVar96;
      auVar32[10] = (char)((uint)uVar2 >> 8);
      auVar32._11_4_ = auVar28._11_4_;
      auVar36._8_2_ = 0;
      auVar36._0_8_ = uVar96;
      auVar36._10_5_ = auVar32._10_5_;
      auVar40[8] = (char)uVar2;
      auVar40._0_8_ = uVar96;
      auVar40._9_6_ = auVar36._9_6_;
      auVar55._7_8_ = 0;
      auVar55._0_7_ = auVar40._8_7_;
      Var51 = CONCAT81(SUB158(auVar55 << 0x40,7),(char)((uint)uVar3 >> 0x18));
      auVar62._9_6_ = 0;
      auVar62._0_9_ = Var51;
      auVar42[4] = (char)((uint)uVar3 >> 0x10);
      auVar42._0_4_ = uVar3;
      auVar42._5_10_ = SUB1510(auVar62 << 0x30,5);
      auVar56._11_4_ = 0;
      auVar56._0_11_ = auVar42._4_11_;
      auVar46[2] = (char)((uint)uVar3 >> 8);
      auVar46._0_2_ = (ushort)uVar3;
      auVar46._3_12_ = SUB1512(auVar56 << 0x20,3);
      sVar133 = auVar79._0_2_;
      sVar135 = auVar79._2_2_;
      sVar103 = auVar83._0_2_;
      sVar106 = auVar83._2_2_;
      uVar80 = CONCAT22(auVar46._2_2_ * sVar106 + auVar45._2_2_ * sVar135,
                        ((ushort)uVar3 & 0xff) * sVar103 + ((ushort)uVar1 & 0xff) * sVar133);
      auVar97._0_8_ =
           CONCAT26((short)Var51 * sVar106 + (short)Var48 * sVar135,
                    CONCAT24(auVar42._4_2_ * sVar103 + auVar41._4_2_ * sVar133,uVar80));
      auVar97._8_2_ = auVar40._8_2_ * sVar103 + auVar39._8_2_ * sVar133;
      auVar97._10_2_ = auVar32._10_2_ * sVar106 + auVar31._10_2_ * sVar135;
      auVar98._12_2_ = auVar24._12_2_ * sVar103 + auVar23._12_2_ * sVar133;
      auVar98._0_12_ = auVar97;
      auVar98._14_2_ = (auVar20._13_2_ >> 8) * sVar106 + (auVar19._13_2_ >> 8) * sVar135;
      auVar87._0_4_ = CONCAT22((short)uVar69,(short)(0x100 - uVar69));
      auVar87._4_4_ = auVar87._0_4_;
      auVar87._8_4_ = auVar87._0_4_;
      auVar87._12_4_ = auVar87._0_4_;
      auVar93._4_4_ = auVar97._8_4_;
      auVar93._0_4_ = uVar80;
      auVar93._8_4_ = (int)((ulong)auVar97._0_8_ >> 0x20);
      auVar93._12_4_ = auVar98._12_4_;
      auVar81 = pshuflw(auVar93,auVar93,0xd8);
      auVar81 = pshufhw(auVar81,auVar81,0xd8);
      auVar94._0_2_ = auVar81._0_2_ >> 8;
      auVar94._2_2_ = auVar81._2_2_ >> 8;
      auVar94._4_2_ = auVar81._4_2_ >> 8;
      auVar94._6_2_ = auVar81._6_2_ >> 8;
      auVar94._8_2_ = auVar81._8_2_ >> 8;
      auVar94._10_2_ = auVar81._10_2_ >> 8;
      auVar94._12_2_ = auVar81._12_2_ >> 8;
      auVar94._14_2_ = auVar81._14_2_ >> 8;
      auVar81 = pmaddwd(auVar94,auVar87);
      auVar95._0_4_ = auVar81._0_4_ >> 8;
      auVar95._4_4_ = auVar81._4_4_ >> 8;
      auVar95._8_4_ = auVar81._8_4_ >> 8;
      auVar95._12_4_ = auVar81._12_4_ >> 8;
      auVar81 = packssdw(auVar95,auVar95);
      sVar133 = auVar81._0_2_;
      sVar135 = auVar81._2_2_;
      sVar103 = auVar81._4_2_;
      sVar106 = auVar81._6_2_;
      *b = CONCAT13((0 < sVar106) * (sVar106 < 0x100) * auVar81[6] - (0xff < sVar106),
                    CONCAT12((0 < sVar103) * (sVar103 < 0x100) * auVar81[4] - (0xff < sVar103),
                             CONCAT11((0 < sVar135) * (sVar135 < 0x100) * auVar81[2] -
                                      (0xff < sVar135),
                                      (0 < sVar133) * (sVar133 < 0x100) * auVar81[0] -
                                      (0xff < sVar133))));
      *fx = *fx + fdx;
      b = b + 1;
    } while (b < end);
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_downscale_helper(uint *b, uint *end, const QTextureData &image,
                                                                          int &fx, int &fy, int fdx, int /*fdy*/)
{
    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uint *s1 = (const uint *)image.scanLine(y1);
    const uint *s2 = (const uint *)image.scanLine(y2);
    const int disty8 = (fy & 0x0000ffff) >> 8;
    const int disty4 = (disty8 + 0x08) >> 4;

    if (blendType != BlendTransformedBilinearTiled) {
        const qint64 min_fx = qint64(image.x1) * fixed_scale;
        const qint64 max_fx = qint64(image.x2 - 1) * fixed_scale;
        while (b < end) {
            int x1 = (fx >> 16);
            int x2;
            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            if (x1 != x2)
                break;
            uint top = s1[x1];
            uint bot = s2[x1];
            *b = INTERPOLATE_PIXEL_256(top, 256 - disty8, bot, disty8);
            fx += fdx;
            ++b;
        }
        uint *boundedEnd = end;
        if (fdx > 0)
            boundedEnd = qMin(boundedEnd, b + (max_fx - fx) / fdx);
        else if (fdx < 0)
            boundedEnd = qMin(boundedEnd, b + (min_fx - fx) / fdx);
        // A fast middle part without boundary checks
#if defined(__SSE2__)
        const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
        const __m128i v_256 = _mm_set1_epi16(256);
        const __m128i v_disty = _mm_set1_epi16(disty4);
        const __m128i v_fdx = _mm_set1_epi32(fdx*4);
        const __m128i v_fx_r = _mm_set1_epi32(0x8);
        __m128i v_fx = _mm_setr_epi32(fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx);

        while (b < boundedEnd - 3) {
            __m128i offset = _mm_srli_epi32(v_fx, 16);
            const int offset0 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset1 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset2 = _mm_cvtsi128_si32(offset); offset = _mm_srli_si128(offset, 4);
            const int offset3 = _mm_cvtsi128_si32(offset);
            const __m128i tl = _mm_setr_epi32(s1[offset0], s1[offset1], s1[offset2], s1[offset3]);
            const __m128i tr = _mm_setr_epi32(s1[offset0 + 1], s1[offset1 + 1], s1[offset2 + 1], s1[offset3 + 1]);
            const __m128i bl = _mm_setr_epi32(s2[offset0], s2[offset1], s2[offset2], s2[offset3]);
            const __m128i br = _mm_setr_epi32(s2[offset0 + 1], s2[offset1 + 1], s2[offset2 + 1], s2[offset3 + 1]);

            __m128i v_distx = _mm_srli_epi16(v_fx, 8);
            v_distx = _mm_srli_epi16(_mm_add_epi32(v_distx, v_fx_r), 4);
            v_distx = _mm_shufflehi_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));
            v_distx = _mm_shufflelo_epi16(v_distx, _MM_SHUFFLE(2,2,0,0));

            interpolate_4_pixels_16_sse2(tl, tr, bl, br, v_distx, v_disty, colorMask, v_256, b);
            b += 4;
            v_fx = _mm_add_epi32(v_fx, v_fdx);
        }
        fx = _mm_cvtsi128_si32(v_fx);
#elif defined(__ARM_NEON__)
        const int16x8_t colorMask = vdupq_n_s16(0x00ff);
        const int16x8_t invColorMask = vmvnq_s16(colorMask);
        const int16x8_t v_256 = vdupq_n_s16(256);
        const int16x8_t v_disty = vdupq_n_s16(disty4);
        const int16x8_t v_disty_ = vshlq_n_s16(v_disty, 4);
        int32x4_t v_fdx = vdupq_n_s32(fdx*4);

        int32x4_t v_fx = vmovq_n_s32(fx);
        v_fx = vsetq_lane_s32(fx + fdx, v_fx, 1);
        v_fx = vsetq_lane_s32(fx + fdx * 2, v_fx, 2);
        v_fx = vsetq_lane_s32(fx + fdx * 3, v_fx, 3);

        const int32x4_t v_ffff_mask = vdupq_n_s32(0x0000ffff);
        const int32x4_t v_fx_r = vdupq_n_s32(0x0800);

         // Pre-initialize to work-around code-analysis warnings/crashes in MSVC:
        uint32x4x2_t v_top = {};
        uint32x4x2_t v_bot = {};
        while (b < boundedEnd - 3) {
            int x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 0);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 0);
            x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 1);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 1);
            x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 2);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 2);
            x1 = (fx >> 16);
            fx += fdx;
            v_top = vld2q_lane_u32(s1 + x1, v_top, 3);
            v_bot = vld2q_lane_u32(s2 + x1, v_bot, 3);

            int32x4_t v_distx = vshrq_n_s32(vaddq_s32(vandq_s32(v_fx, v_ffff_mask), v_fx_r), 12);
            v_distx = vorrq_s32(v_distx, vshlq_n_s32(v_distx, 16));

            interpolate_4_pixels_16_neon(
                        vreinterpretq_s16_u32(v_top.val[0]), vreinterpretq_s16_u32(v_top.val[1]),
                    vreinterpretq_s16_u32(v_bot.val[0]), vreinterpretq_s16_u32(v_bot.val[1]),
                    vreinterpretq_s16_s32(v_distx), v_disty, v_disty_,
                    colorMask, invColorMask, v_256, b);
            b+=4;
            v_fx = vaddq_s32(v_fx, v_fdx);
        }
#elif defined (__loongarch_sx)
        const __m128i shuffleMask = (__m128i)(v8i16){0, 0, 2, 2, 4, 4, 6, 6};
        const __m128i v_disty = __lsx_vreplgr2vr_h(disty4);
        const __m128i v_fdx = __lsx_vreplgr2vr_w(fdx*4);
        const __m128i v_fx_r = __lsx_vreplgr2vr_w(0x8);
        __m128i v_fx = (__m128i)(v4i32){fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx};

        while (b < boundedEnd - 3) {
            __m128i offset = __lsx_vsrli_w(v_fx, 16);
            const int offset0 = __lsx_vpickve2gr_w(offset, 0);
            const int offset1 = __lsx_vpickve2gr_w(offset, 1);
            const int offset2 = __lsx_vpickve2gr_w(offset, 2);
            const int offset3 = __lsx_vpickve2gr_w(offset, 3);
            const __m128i tl = (__m128i)(v4u32){s1[offset0], s1[offset1], s1[offset2], s1[offset3]};
            const __m128i tr = (__m128i)(v4u32){s1[offset0 + 1], s1[offset1 + 1], s1[offset2 + 1], s1[offset3 + 1]};
            const __m128i bl = (__m128i)(v4u32){s2[offset0], s2[offset1], s2[offset2], s2[offset3]};
            const __m128i br = (__m128i)(v4u32){s2[offset0 + 1], s2[offset1 + 1], s2[offset2 + 1], s2[offset3 + 1]};

            __m128i v_distx = __lsx_vsrli_h(v_fx, 8);
            v_distx = __lsx_vsrli_h(__lsx_vadd_w(v_distx, v_fx_r), 4);
            v_distx = __lsx_vshuf_h(shuffleMask, v_distx, v_distx);

            interpolate_4_pixels_16_lsx(tl, tr, bl, br, v_distx, v_disty, b);
            b += 4;
            v_fx = __lsx_vadd_w(v_fx, v_fdx);
        }
        fx = __lsx_vpickve2gr_w(v_fx, 0);
#endif
        while (b < boundedEnd) {
            int x = (fx >> 16);
            if (hasFastInterpolate4()) {
                int distx8 = (fx & 0x0000ffff) >> 8;
                *b = interpolate_4_pixels(s1 + x, s2 + x, distx8, disty8);
            } else {
                int distx4 = ((fx & 0x0000ffff) + 0x0800) >> 12;
                *b = interpolate_4_pixels_16(s1[x], s1[x + 1], s2[x], s2[x + 1], distx4, disty4);
            }
            fx += fdx;
            ++b;
        }
    }

    while (b < end) {
        int x1 = (fx >> 16);
        int x2;
        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        uint tl = s1[x1];
        uint tr = s1[x2];
        uint bl = s2[x1];
        uint br = s2[x2];
        if (hasFastInterpolate4()) {
            int distx8 = (fx & 0x0000ffff) >> 8;
            *b = interpolate_4_pixels(tl, tr, bl, br, distx8, disty8);
        } else {
            int distx4 = ((fx & 0x0000ffff) + 0x0800) >> 12;
            *b = interpolate_4_pixels_16(tl, tr, bl, br, distx4, disty4);
        }
        fx += fdx;
        ++b;
    }
}